

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O1

UConverter * u_getDefaultConverter_63(UErrorCode *status)

{
  UConverter *pUVar1;
  UConverter *converter;
  
  if (gDefaultConverter == (UConverter *)0x0) {
    converter = (UConverter *)0x0;
  }
  else {
    umtx_lock_63((UMutex *)0x0);
    pUVar1 = gDefaultConverter;
    converter = (UConverter *)0x0;
    if (gDefaultConverter != (UConverter *)0x0) {
      gDefaultConverter = (UConverter *)0x0;
      converter = pUVar1;
    }
    umtx_unlock_63((UMutex *)0x0);
  }
  if (converter == (UConverter *)0x0) {
    converter = ucnv_open_63((char *)0x0,status);
    if (U_ZERO_ERROR < *status) {
      ucnv_close_63(converter);
      converter = (UConverter *)0x0;
    }
  }
  return converter;
}

Assistant:

U_CAPI UConverter* U_EXPORT2
u_getDefaultConverter(UErrorCode *status)
{
    UConverter *converter = NULL;
    
    if (gDefaultConverter != NULL) {
        umtx_lock(NULL);
        
        /* need to check to make sure it wasn't taken out from under us */
        if (gDefaultConverter != NULL) {
            converter = gDefaultConverter;
            gDefaultConverter = NULL;
        }
        umtx_unlock(NULL);
    }

    /* if the cache was empty, create a converter */
    if(converter == NULL) {
        converter = ucnv_open(NULL, status);
        if(U_FAILURE(*status)) {
            ucnv_close(converter);
            converter = NULL;
        }
    }

    return converter;
}